

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void IntVariableCommand(IResult *pResult,void *pUserData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  char aBuf [1024];
  char acStack_428 [1032];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResult->m_NumArgs == 0) {
    str_format(acStack_428,0x400,"Value: %d",(ulong)**(uint **)((long)pUserData + 8));
    (**(code **)(**pUserData + 200))(*pUserData,0,"console",acStack_428,0);
    pResult->m_Value = **(int **)((long)pUserData + 8);
  }
  else {
    iVar2 = (*pResult->_vptr_IResult[2])(pResult,0);
    iVar3 = *(int *)((long)pUserData + 0x10);
    iVar1 = *(int *)((long)pUserData + 0x14);
    if (iVar3 != iVar1) {
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      iVar2 = iVar1;
      if (iVar3 < iVar1) {
        iVar2 = iVar3;
      }
      if (iVar1 == 0) {
        iVar2 = iVar3;
      }
    }
    **(int **)((long)pUserData + 8) = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void IntVariableCommand(IConsole::IResult *pResult, void *pUserData)
{
	CIntVariableData *pData = (CIntVariableData *)pUserData;

	if(pResult->NumArguments())
	{
		int Val = pResult->GetInteger(0);

		// do clamping
		if(pData->m_Min != pData->m_Max)
		{
			if (Val < pData->m_Min)
				Val = pData->m_Min;
			if (pData->m_Max != 0 && Val > pData->m_Max)
				Val = pData->m_Max;
		}

		*(pData->m_pVariable) = Val;
	}
	else
	{
		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "Value: %d", *(pData->m_pVariable));
		pData->m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);
		pResult->m_Value = *(pData->m_pVariable);
	}
}